

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_SetLocalProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  Var aValue;
  bool bVar1;
  PropertyId pid;
  RecyclableObject *instance;
  ConstructorCache *pCVar2;
  InlineCache *local_30;
  
  aValue = *(Var *)(this + 0x58);
  pid = FunctionBody::GetPropertyIdFromCacheId
                  (*(FunctionBody **)(this + 0x88),(uint)playout->inlineCacheIndex);
  bVar1 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar1) {
    instance = UnsafeVarTo<Js::RecyclableObject>(aValue);
    bVar1 = TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
                      (this,playout,pid,instance,&local_30,PropertyOperation_None);
    if (bVar1) {
      pCVar2 = JavascriptFunction::GetConstructorCache(*(JavascriptFunction **)(this + 0x80));
      if ((pCVar2->content).updateAfterCtor != true) {
        return;
      }
      InlineCache::RemoveFromInvalidationListAndClear
                (local_30,*(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8));
      return;
    }
  }
  DoSetProperty_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
            (this,playout,aValue,PropertyOperation_None);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetLocalProperty(unaligned T* playout)
    {
        DoSetProperty(playout, this->localClosure, PropertyOperation_None);
    }